

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O1

void Llb_NonlinRecomputeScores(Llb_Mgr_t *p)

{
  Llb_Prt_t *pLVar1;
  Llb_Var_t **ppLVar2;
  Llb_Var_t *pLVar3;
  int *piVar4;
  Llb_Prt_t **ppLVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  if (0 < p->iPartFree) {
    lVar10 = 0;
    do {
      pLVar1 = p->pParts[lVar10];
      if (pLVar1 != (Llb_Prt_t *)0x0) {
        iVar6 = Cudd_DagSize(pLVar1->bFunc);
        pLVar1->nSize = iVar6;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->iPartFree);
  }
  iVar6 = p->nVars;
  if (0 < (long)iVar6) {
    ppLVar2 = p->pVars;
    lVar10 = 0;
    do {
      pLVar3 = ppLVar2[lVar10];
      if (pLVar3 != (Llb_Var_t *)0x0) {
        pLVar3->nScore = 0;
        lVar7 = (long)pLVar3->vParts->nSize;
        if (0 < lVar7) {
          piVar4 = pLVar3->vParts->pArray;
          ppLVar5 = p->pParts;
          iVar8 = pLVar3->nScore;
          lVar9 = 0;
          do {
            iVar8 = iVar8 + ppLVar5[piVar4[lVar9]]->nSize;
            pLVar3->nScore = iVar8;
            lVar9 = lVar9 + 1;
          } while (lVar7 != lVar9);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar6);
  }
  return;
}

Assistant:

void Llb_NonlinRecomputeScores( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i, k;
    Llb_MgrForEachPart( p, pPart, i )
        pPart->nSize = Cudd_DagSize(pPart->bFunc);
    Llb_MgrForEachVar( p, pVar, i )
    {
        pVar->nScore = 0;
        Llb_VarForEachPart( p, pVar, pPart, k )
            pVar->nScore += pPart->nSize;
    }
}